

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O2

cmCMakePath * __thiscall cmCMakePath::GetStem(cmCMakePath *__return_storage_ptr__,cmCMakePath *this)

{
  path pStack_38;
  
  std::filesystem::__cxx11::path::stem(&pStack_38,&this->Path);
  std::filesystem::__cxx11::path::path(&__return_storage_ptr__->Path,&pStack_38);
  std::filesystem::__cxx11::path::~path(&pStack_38);
  return __return_storage_ptr__;
}

Assistant:

cmCMakePath GetStem() const { return this->Path.stem(); }